

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

int Curl_fnmatch(void *ptr,char *pattern,char *string)

{
  int iVar1;
  char *string_local;
  char *pattern_local;
  void *ptr_local;
  
  if ((pattern == (char *)0x0) || (string == (char *)0x0)) {
    ptr_local._4_4_ = 2;
  }
  else {
    iVar1 = fnmatch(pattern,string,0);
    if (iVar1 == 0) {
      ptr_local._4_4_ = 0;
    }
    else if (iVar1 == 1) {
      ptr_local._4_4_ = 1;
    }
    else {
      ptr_local._4_4_ = 2;
    }
  }
  return ptr_local._4_4_;
}

Assistant:

int Curl_fnmatch(void *ptr, const char *pattern, const char *string)
{
  (void)ptr; /* the argument is specified by the curl_fnmatch_callback
                prototype, but not used by Curl_fnmatch() */
  if(!pattern || !string) {
    return CURL_FNMATCH_FAIL;
  }

  switch(fnmatch(pattern, string, 0)) {
  case 0:
    return CURL_FNMATCH_MATCH;
  case FNM_NOMATCH:
    return CURL_FNMATCH_NOMATCH;
  default:
    return CURL_FNMATCH_FAIL;
  }
  /* not reached */
}